

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

int Str_MuxDelayEdge_rec(Str_Mux_t *pMux,int i)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  
  lVar10 = (long)pMux->Edge[i].Fan;
  if (0 < lVar10) {
    iVar1 = pMux->Id;
    Str_MuxDelayEdge_rec(pMux + (lVar10 - iVar1),0);
    Str_MuxDelayEdge_rec(pMux + (lVar10 - iVar1),1);
    uVar5 = pMux[lVar10 - iVar1].Edge[0].FanDel;
    uVar2 = pMux[lVar10 - iVar1].Edge[1].FanDel;
    uVar4 = pMux[lVar10 - iVar1].Edge[2].FanDel;
    iVar7 = (int)uVar5 >> 4;
    iVar8 = (int)uVar2 >> 4;
    iVar6 = iVar8;
    if (iVar8 < iVar7) {
      iVar6 = iVar7;
    }
    iVar9 = (int)uVar4 >> 4;
    iVar3 = iVar9;
    if (iVar9 < iVar6) {
      iVar3 = iVar6;
    }
    uVar5 = uVar5 & 0xf;
    if (iVar3 != iVar7) {
      uVar5 = 1;
    }
    uVar2 = uVar2 & 0xf;
    if (iVar3 != iVar8) {
      uVar2 = 1;
    }
    uVar4 = uVar4 & 0xf;
    if (iVar9 < iVar6) {
      uVar4 = 1;
    }
    iVar7 = uVar4 + uVar2 + uVar5;
    iVar6 = 0x13;
    if (iVar7 <= pMux[lVar10 - iVar1].nLutSize) {
      iVar6 = iVar7;
    }
    pMux->Edge[i].FanDel = iVar6 + iVar3 * 0x10;
  }
  return pMux->Edge[i].FanDel;
}

Assistant:

int Str_MuxDelayEdge_rec( Str_Mux_t * pMux, int i )
{
    if ( pMux->Edge[i].Fan > 0 )
    {
        Str_Mux_t * pFanin = Str_MuxFanin( pMux, i );
        Str_MuxDelayEdge_rec( pFanin, 0 );
        Str_MuxDelayEdge_rec( pFanin, 1 );
        pMux->Edge[i].FanDel = Str_Delay3( pFanin->Edge[0].FanDel, pFanin->Edge[1].FanDel, pFanin->Edge[2].FanDel, pFanin->nLutSize );
    }
    return pMux->Edge[i].FanDel;
}